

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::Swap
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *other)

{
  CodeGeneratorResponse_File *other_local;
  CodeGeneratorResponse_File *this_local;
  
  if (other != this) {
    std::swap<std::__cxx11::string*>(&this->name_,&other->name_);
    std::swap<std::__cxx11::string*>(&this->insertion_point_,&other->insertion_point_);
    std::swap<std::__cxx11::string*>(&this->content_,&other->content_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::Swap(CodeGeneratorResponse_File* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    std::swap(insertion_point_, other->insertion_point_);
    std::swap(content_, other->content_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}